

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::SetIsPrototype
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,bool hasNewType)

{
  JavascriptString *propertyKey_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  Type *pTVar6;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_00;
  Type *pTVar7;
  DynamicType *oldType_00;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  DynamicType *this_01;
  DynamicTypeHandler *this_02;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar8;
  RecyclerWeakReference<Js::DynamicObject> *pRVar9;
  DynamicObject *pDVar10;
  undefined4 *puVar11;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar12;
  JavascriptString **ppJVar13;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor_00;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  JavascriptString *propertyKey;
  int i;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldType_1;
  Type *oldType;
  anon_class_8_1_0902ba13 aStack_28;
  bool isShared;
  anon_class_8_1_0902ba13 setFixedFlags;
  bool hasNewType_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  aStack_28.instance = instance;
  setFixedFlags.instance._7_1_ = hasNewType;
  bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
  if ((bVar3) && (bVar3 = DynamicTypeHandler::IsolatePrototypes(), bVar3)) {
    pTVar6 = RecyclableObject::GetType(&instance->super_RecyclableObject);
    this_00 = ConvertToNonSharedSimpleDictionaryType(this,instance);
    pTVar7 = RecyclableObject::GetType(&instance->super_RecyclableObject);
    SetIsPrototype(this_00,instance,pTVar7 != pTVar6);
  }
  else {
    oldType_00 = DynamicObject::GetDynamicType(instance);
    oldSingletonInstanceBefore = GetSingletonInstance(this);
    TraceFixedFieldsBeforeSetIsProto
              (instance,&this->super_DynamicTypeHandler,oldType_00,oldSingletonInstanceBefore);
    if (((setFixedFlags.instance._7_1_ & 1) == 0) &&
       (bVar3 = DynamicTypeHandler::ChangeTypeOnProto(), bVar3)) {
      bVar3 = DynamicObject::HasSharedType(instance);
      if (bVar3) {
        this_01 = DynamicObject::GetDynamicType(instance);
        this_02 = DynamicType::GetTypeHandler(this_01);
        bVar3 = DynamicTypeHandler::GetIsShared(this_02);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xb92,
                                      "(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared())"
                                      ,
                                      "!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared()"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      DynamicObject::ChangeType(instance);
      bVar3 = DynamicObject::HasSharedType(instance);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xb95,"(!instance->HasSharedType())",
                                    "!instance->HasSharedType()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      setFixedFlags.instance._7_1_ = 1;
    }
    if (!bVar2) {
      ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                          ((WriteBarrierPtr *)&this->singletonInstance);
      if (*ppRVar8 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        pRVar9 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                 operator->(&this->singletonInstance);
        pDVar10 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar9);
        if (pDVar10 != instance) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xb9c,
                                      "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                      ,
                                      "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
      }
      bVar2 = HasSingletonInstanceOnlyIfNeeded(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xb9d,"(HasSingletonInstanceOnlyIfNeeded())",
                                    "HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      bVar2 = DynamicTypeHandler::AreSingletonInstancesNeeded();
      if ((bVar2) &&
         (ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                              ((WriteBarrierPtr *)&this->singletonInstance),
         *ppRVar8 == (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
        pRVar9 = DynamicObject::CreateWeakReferenceToSelf(instance);
        Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator=
                  (&this->singletonInstance,pRVar9);
      }
      BVar4 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar4 == 0) {
        propertyKey._4_4_ = 0;
        while( true ) {
          pBVar12 = Memory::
                    WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                    ::operator->(&this->propertyMap);
          iVar5 = JsUtil::
                  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  ::Count(pBVar12);
          if (iVar5 <= propertyKey._4_4_) break;
          pBVar12 = Memory::
                    WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                    ::operator->(&this->propertyMap);
          ppJVar13 = JsUtil::
                     BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                     ::GetKeyAt(pBVar12,propertyKey._4_4_);
          propertyKey_00 = *ppJVar13;
          pBVar12 = Memory::
                    WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                    ::operator->(&this->propertyMap);
          descriptor_00 =
               JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetReferenceAt(pBVar12,propertyKey._4_4_);
          SetIsPrototype::anon_class_8_1_0902ba13::operator()
                    (&stack0xffffffffffffffd8,propertyKey_00,descriptor_00,
                     (bool)(setFixedFlags.instance._7_1_ & 1));
          propertyKey._4_4_ = propertyKey._4_4_ + 1;
        }
      }
    }
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
    TraceFixedFieldsAfterSetIsProto
              (instance,&this->super_DynamicTypeHandler,&this->super_DynamicTypeHandler,oldType_00,
               oldSingletonInstanceBefore);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetIsPrototype(DynamicObject* instance, bool hasNewType)
    {
#if ENABLE_FIXED_FIELDS
        const auto setFixedFlags = [instance](TMapKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* const descriptor, bool hasNewType)
        {
            if (TPropertyKey_IsInternalPropertyId(propertyKey))
            {
                return;
            }
            if (!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                // See PathTypeHandlerBase::ConvertToSimpleDictionaryType for rules governing fixed field bits during type
                // handler transitions.  In addition, we know that the current instance is not yet a prototype.
                if (descriptor->propertyIndex != NoSlots)
                {
                    // Consider: If we decide to fix all types of properties, we could skip loading the value from the instance.
                    if (descriptor->isInitialized)
                    {
                        Var value = instance->GetSlot(descriptor->propertyIndex);
                        // Even though the handler says the property is initialized the particular instance may not yet have
                        // a value for this property.  This should only happen if the handler is shared.
                        if (value != nullptr)
                        {
                            if (hasNewType)
                            {
                                // Since we have a non-shared type handler, it's ok to fix all fields at their current values, as long as
                                // we've also taken a type transition.  Otherwise populated load field caches would still be valid and
                                // would need to be explicitly invalidated if the property value changes.

                                // saravind:If the instance is used by a CrossSiteObject, then we are conservative and do not mark any field as fixed in that instance.
                                // We need to relax this in the future and support fixed fields for Cross Site Context usage
                                descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));

                                // Since we have a new type we can clear all used as fixed bits.  That's because any instance field loads
                                // will have been invalidated by the type transition, and there are no proto fields loads from this object
                                // because it is just now becoming a proto.
                                descriptor->usedAsFixed = false;
                            }
                        }
                    }
                    else
                    {
                        Assert(!descriptor->isFixed && !descriptor->usedAsFixed);
                    }
                }
            }
        };

        bool isShared = GetIsShared();
#endif
        if (GetIsOrMayBecomeShared() && IsolatePrototypes())
        {
            Type* oldType = instance->GetType();
            ConvertToNonSharedSimpleDictionaryType(instance)->SetIsPrototype(instance, instance->GetType() != oldType);
        }
        else
        {

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = instance->GetDynamicType();
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeSetIsProto(instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (!hasNewType && ChangeTypeOnProto())
            {
                // We're about to split out the type.  If the original type was shared the handler better be shared as well.
                // Otherwise, the handler would lose track of being shared between different types and instances.
                Assert(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared());
                // Forcing a type transition allows us to fix all fields (even those that were previously marked as non-fixed).
                instance->ChangeType();
                Assert(!instance->HasSharedType());
                hasNewType = true;
            }

#if ENABLE_FIXED_FIELDS
            if (!isShared)
            {
                Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);
                Assert(HasSingletonInstanceOnlyIfNeeded());
                if (AreSingletonInstancesNeeded() && this->singletonInstance == nullptr)
                {
                    this->singletonInstance = instance->CreateWeakReferenceToSelf();
                }

                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                if (!instance->IsExternal())
                {
                    // If this type handler is not shared by any types or instances we can simply mark all existing properties as fixed.
                    // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
                    for (int i = 0; i < propertyMap->Count(); i++)
                    {
                        TMapKey propertyKey = propertyMap->GetKeyAt(i);
                        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* const descriptor = propertyMap->GetReferenceAt(i);
                        setFixedFlags(propertyKey, descriptor, hasNewType);
                    }
                }
            }
#endif

            SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterSetIsProto(instance, this, this, oldType, oldSingletonInstance);
#endif
#endif
        }
    }